

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::InputFile::rawPixelDataToBuffer
          (InputFile *this,int scanLine,char *pixelData,int *pixelDataSize)

{
  Data *pDVar1;
  ArgExc *this_00;
  char *text;
  stringstream _iex_replace_s;
  
  pDVar1 = this->_data;
  if (pDVar1->dsFile == (DeepScanLineInputFile *)0x0) {
    if (pDVar1->isTiled != true) {
      ScanLineInputFile::rawPixelDataToBuffer(pDVar1->sFile,scanLine,pixelData,pixelDataSize);
      return;
    }
    text = "Tried to read a raw scanline from a tiled image.";
  }
  else {
    text = "Tried to read a raw scanline from a deep image.";
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,text);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
InputFile::rawPixelDataToBuffer (int scanLine,
                                 char *pixelData,
                                 int &pixelDataSize) const
{
    try
    {
        if (_data->dsFile)
        {
            throw IEX_NAMESPACE::ArgExc ("Tried to read a raw scanline "
                                         "from a deep image.");
        }
        
        else if (_data->isTiled)
        {
            throw IEX_NAMESPACE::ArgExc ("Tried to read a raw scanline "
                                         "from a tiled image.");
        }
        
        _data->sFile->rawPixelDataToBuffer(scanLine, pixelData, pixelDataSize);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}